

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderIsNamespaceDecl(xmlTextReaderPtr reader)

{
  uint uVar1;
  xmlNodePtr pxVar2;
  
  uVar1 = 0xffffffff;
  if ((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNodePtr)0x0)) {
    pxVar2 = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      pxVar2 = reader->curnode;
    }
    uVar1 = (uint)(pxVar2->type == XML_NAMESPACE_DECL);
  }
  return uVar1;
}

Assistant:

int
xmlTextReaderIsNamespaceDecl(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    if (XML_NAMESPACE_DECL == node->type)
	return(1);
    else
	return(0);
}